

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>
                   (appender out,big_decimal_fp *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,char decimal_point)

{
  int iVar1;
  int iVar2;
  int iVar3;
  type tVar4;
  appender aVar5;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  undefined3 in_register_00000081;
  size_t size;
  char cVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  char local_ce;
  bool pointy;
  int num_zeros;
  sign_t sign;
  int significand_size;
  ulong local_c0;
  basic_format_specs<char> *local_b8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_b0;
  undefined4 local_a4;
  char *significand;
  int local_98;
  int exp;
  ulong local_90;
  char *local_88;
  float_specs fspecs_local;
  anon_class_40_7_ef14d3db write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  local_a4 = CONCAT31(in_register_00000081,decimal_point);
  significand = fp->significand;
  iVar1 = fp->significand_size;
  uVar13 = (ulong)fspecs >> 0x20;
  uVar8 = fspecs._4_4_;
  sign = uVar8 >> 8 & 0xff;
  bVar15 = sign != none;
  local_ce = decimal_point;
  significand_size = iVar1;
  local_b8 = specs;
  local_b0 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_88 = significand;
  fspecs_local = fspecs;
  tVar4 = to_unsigned<int>(iVar1);
  local_c0 = (ulong)(bVar15 + tVar4);
  iVar10 = fp->exponent;
  local_98 = iVar1 + iVar10 + -1;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_98;
  bVar15 = write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char>::
           anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar9 = local_c0;
  uVar7 = fspecs.precision;
  if (bVar15) {
    iVar10 = iVar10 + iVar1;
    local_90 = uVar13;
    if ((uVar8 >> 0x14 & 1) == 0) {
      iVar14 = 0;
      cVar12 = (char)local_a4;
      if (iVar1 == 1) {
        cVar12 = '\0';
      }
    }
    else {
      iVar14 = 0;
      if (0 < (int)(uVar7 - iVar1)) {
        iVar14 = uVar7 - iVar1;
      }
      tVar4 = to_unsigned<int>(iVar14);
      uVar9 = local_c0 + tVar4;
      cVar12 = (char)local_a4;
    }
    iVar3 = local_98;
    iVar2 = 1 - iVar10;
    if (0 < iVar10) {
      iVar2 = local_98;
    }
    iVar10 = 2;
    if (99 < iVar2) {
      iVar10 = (999 < iVar2) + 3;
    }
    tVar4 = to_unsigned<int>((3 - (uint)(cVar12 == '\0')) + iVar10);
    write._0_8_ = CONCAT44(write._4_4_,uVar8 >> 8) & 0xffffffff000000ff;
    write.significand = local_88;
    write.decimal_point = cVar12;
    write.significand_size = iVar1;
    write._24_8_ = CONCAT35(write._29_3_,CONCAT14((((uint)local_90 >> 0x10 & 1) == 0) << 5,iVar14))
                   | 0x4500000000;
    write.output_exp = iVar3;
    if (0 < local_b8->width) {
      aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_1_&>
                        ((appender)local_b0.container,local_b8,uVar9 + tVar4,&write);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    aVar5 = write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char>::
            anon_class_40_7_ef14d3db::operator()(&write,(iterator)local_b0.container);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  iVar14 = fp->exponent;
  iVar10 = iVar1 + iVar14;
  exp = iVar10;
  if (-1 < iVar14) {
    tVar4 = to_unsigned<int>(iVar14);
    size = tVar4 + local_c0;
    num_zeros = uVar7 - iVar10;
    if ((uVar8 >> 0x14 & 1) != 0) {
      if (fspecs._4_1_ == '\x02' || 0 < num_zeros) {
        if (num_zeros < 1) goto LAB_0016d532;
      }
      else {
        num_zeros = 1;
      }
      tVar4 = to_unsigned<int>(num_zeros);
      size = size + (tVar4 + 1);
    }
LAB_0016d532:
    write._0_8_ = &sign;
    write.significand = (char *)&significand;
    write._16_8_ = &significand_size;
    write._32_8_ = &fspecs_local;
    write._24_8_ = fp;
    aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_2_>
                      ((appender)local_b0.container,local_b8,size,(anon_class_56_7_a2a26a24 *)&write
                      );
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  if (0 < iVar10) {
    num_zeros = uVar7 - iVar1 & (int)(uVar8 << 0xb) >> 0x1f;
    uVar8 = num_zeros;
    if (num_zeros < 1) {
      uVar8 = 0;
    }
    tVar4 = to_unsigned<int>(uVar8);
    write._0_8_ = &sign;
    write.significand = (char *)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = &exp;
    write._32_8_ = &local_ce;
    aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_3_>
                      ((appender)local_b0.container,local_b8,(tVar4 + 1) + local_c0,
                       (anon_class_48_6_48d028d1 *)&write);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  uVar11 = -iVar10;
  num_zeros = uVar11;
  if (uVar7 < uVar11) {
    num_zeros = uVar7;
  }
  if ((int)uVar7 < 0) {
    num_zeros = uVar11;
  }
  if (iVar1 != 0) {
    num_zeros = uVar11;
  }
  if (iVar1 == 0 && num_zeros == 0) {
    pointy = SUB41((uVar8 & 0x100000) >> 0x14,0);
    if (((ulong)fspecs & 0x10000000000000) == 0) {
      iVar1 = 1;
      goto LAB_0016d5de;
    }
  }
  else {
    pointy = true;
  }
  iVar1 = 2;
LAB_0016d5de:
  tVar4 = to_unsigned<int>(num_zeros);
  write._0_8_ = &sign;
  write.significand = &pointy;
  write._16_8_ = &local_ce;
  write._24_8_ = &num_zeros;
  write._32_8_ = &significand;
  bVar6.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_4_>
                 (local_b0.container,local_b8,(iVar1 + tVar4) + uVar9,
                  (anon_class_48_6_d9b5e731 *)&write);
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar6.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 Char decimal_point) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = detail::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}